

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O1

void __thiscall
vmips::BinaryImm::collect_register(BinaryImm *this,unordered_set<std::shared_ptr<VirtReg>_> *set)

{
  shared_ptr<vmips::VirtReg> *key;
  shared_ptr<vmips::VirtReg> *key_1;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::iterator,_bool>
  pStack_48;
  
  if (((this->lhs).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->allocated
      == false) {
    phmap::priv::
    parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
    ::emplace_decomposable<std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>const&>
              (&pStack_48,
               (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
                *)set,&this->lhs,&this->lhs);
  }
  if (((this->rhs).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->allocated
      == false) {
    phmap::priv::
    parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
    ::emplace_decomposable<std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>const&>
              (&pStack_48,
               (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
                *)set,&this->rhs,&this->rhs);
  }
  return;
}

Assistant:

void BinaryImm::collect_register(unordered_set<std::shared_ptr<VirtReg>> &set) const {
    if (!lhs->allocated) set.insert(lhs);
    if (!rhs->allocated) set.insert(rhs);
}